

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void __thiscall
cimg_library::CImgIOException::CImgIOException(CImgIOException *this,char *format,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  va_list ap2;
  undefined8 local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined8 local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  CImgException::CImgException(&this->super_CImgException);
  *(undefined ***)&this->super_CImgException = &PTR__CImgException_002e8ef0;
  local_118 = 0x3000000010;
  local_110 = &stack0x00000008;
  local_f8 = 0x3000000010;
  local_108 = local_d8;
  local_f0 = local_110;
  local_e8 = local_d8;
  iVar1 = vsnprintf((char *)0x0,0,format,&local_f8);
  if (-1 < iVar1) {
    pcVar2 = (this->super_CImgException)._message;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    pcVar2 = (char *)operator_new__((ulong)(iVar1 + 1));
    (this->super_CImgException)._message = pcVar2;
    vsnprintf(pcVar2,(ulong)(iVar1 + 1),format,&local_118);
    if (cimg::exception_mode::mode != 0) {
      __stream = (FILE *)cimg::output((FILE *)0x0);
      fprintf(__stream,"\n%s[CImg] *** %s ***%s %s\n");
      if ((cimg::exception_mode::mode & 1) == 0) {
        cimg::dialog("CImgIOException",(this->super_CImgException)._message,"Abort",(char *)0x0,
                     (char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,false);
      }
      if (2 < cimg::exception_mode::mode) {
        cimg::info();
      }
    }
  }
  return;
}

Assistant:

CImgIOException(const char *const format, ...) { _cimg_exception_err("CImgIOException",true); }